

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

bool google::protobuf::compiler::ruby::GenerateMessage
               (Descriptor *message,Printer *printer,string *error)

{
  string *this;
  bool bVar1;
  int iVar2;
  LogMessage *other;
  MessageOptions *this_00;
  string *args_1;
  FieldDescriptor *this_01;
  OneofDescriptor *pOVar3;
  Descriptor *message_00;
  EnumDescriptor *en;
  int local_98;
  int local_94;
  int i_3;
  int i_2;
  OneofDescriptor *oneof;
  int i_1;
  FieldDescriptor *field;
  LogFinisher local_6d;
  int i;
  LogMessage local_60;
  string *local_28;
  string *error_local;
  Printer *printer_local;
  Descriptor *message_local;
  
  local_28 = error;
  error_local = (string *)printer;
  printer_local = (Printer *)message;
  iVar2 = Descriptor::extension_range_count(message);
  if ((0 < iVar2) || (iVar2 = Descriptor::extension_count((Descriptor *)printer_local), 0 < iVar2))
  {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_WARNING,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/ruby/ruby_generator.cc"
               ,0xfa);
    other = internal::LogMessage::operator<<
                      (&local_60,"Extensions are not yet supported for proto2 .proto files.");
    internal::LogFinisher::operator=(&local_6d,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  this_00 = Descriptor::options((Descriptor *)printer_local);
  bVar1 = MessageOptions::map_entry(this_00);
  this = error_local;
  if (!bVar1) {
    args_1 = Descriptor::full_name_abi_cxx11_((Descriptor *)printer_local);
    io::Printer::Print<char[5],std::__cxx11::string>
              ((Printer *)this,"add_message \"$name$\" do\n",(char (*) [5])0x77db8d,args_1);
    io::Printer::Indent((Printer *)error_local);
    for (field._4_4_ = 0; iVar2 = Descriptor::field_count((Descriptor *)printer_local),
        field._4_4_ < iVar2; field._4_4_ = field._4_4_ + 1) {
      this_01 = Descriptor::field((Descriptor *)printer_local,field._4_4_);
      pOVar3 = FieldDescriptor::real_containing_oneof(this_01);
      if (pOVar3 == (OneofDescriptor *)0x0) {
        GenerateField(this_01,(Printer *)error_local);
      }
    }
    for (oneof._4_4_ = 0; iVar2 = Descriptor::real_oneof_decl_count((Descriptor *)printer_local),
        oneof._4_4_ < iVar2; oneof._4_4_ = oneof._4_4_ + 1) {
      pOVar3 = Descriptor::oneof_decl((Descriptor *)printer_local,oneof._4_4_);
      GenerateOneof(pOVar3,(Printer *)error_local);
    }
    io::Printer::Outdent((Printer *)error_local);
    io::Printer::Print<>((Printer *)error_local,"end\n");
    for (local_94 = 0; iVar2 = Descriptor::nested_type_count((Descriptor *)printer_local),
        local_94 < iVar2; local_94 = local_94 + 1) {
      message_00 = Descriptor::nested_type((Descriptor *)printer_local,local_94);
      bVar1 = GenerateMessage(message_00,(Printer *)error_local,local_28);
      if (!bVar1) {
        return false;
      }
    }
    for (local_98 = 0; iVar2 = Descriptor::enum_type_count((Descriptor *)printer_local),
        local_98 < iVar2; local_98 = local_98 + 1) {
      en = Descriptor::enum_type((Descriptor *)printer_local,local_98);
      GenerateEnum(en,(Printer *)error_local);
    }
  }
  return true;
}

Assistant:

bool GenerateMessage(const Descriptor* message, io::Printer* printer,
                     std::string* error) {
  if (message->extension_range_count() > 0 || message->extension_count() > 0) {
    GOOGLE_LOG(WARNING) << "Extensions are not yet supported for proto2 .proto files.";
  }

  // Don't generate MapEntry messages -- we use the Ruby extension's native
  // support for map fields instead.
  if (message->options().map_entry()) {
    return true;
  }

  printer->Print(
    "add_message \"$name$\" do\n",
    "name", message->full_name());
  printer->Indent();

  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    if (!field->real_containing_oneof()) {
      GenerateField(field, printer);
    }
  }

  for (int i = 0; i < message->real_oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    GenerateOneof(oneof, printer);
  }

  printer->Outdent();
  printer->Print("end\n");

  for (int i = 0; i < message->nested_type_count(); i++) {
    if (!GenerateMessage(message->nested_type(i), printer, error)) {
      return false;
    }
  }
  for (int i = 0; i < message->enum_type_count(); i++) {
    GenerateEnum(message->enum_type(i), printer);
  }

  return true;
}